

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

bool __thiscall duckdb_shell::ShellState::ImportData(ShellState *this,char **azArg,idx_t nArg)

{
  int iVar1;
  uint uVar2;
  sqlite3_int64 sVar3;
  char *pcVar4;
  undefined1 *puVar5;
  long lVar6;
  char *pcVar7;
  idx_t iVar8;
  int iVar9;
  sqlite3_callback in_RDX;
  long in_RSI;
  long in_RDI;
  bool bVar10;
  _func_void_void_ptr *in_stack_00000008;
  int in_stack_00000014;
  char *in_stack_00000018;
  int in_stack_00000024;
  sqlite3_stmt *in_stack_00000028;
  char *z_1;
  int i_2;
  int startLine;
  int i_1;
  char cSep;
  char *zCreate;
  char zSep [2];
  int nSep;
  char *z;
  idx_t i;
  int useOutputMode;
  int nSkip;
  int eVerbose;
  _func_char_ptr_ImportCtx_ptr *xRead;
  ImportCtx sCtx;
  char *zSql;
  int needCommit;
  int j;
  int nByte;
  int nCol;
  sqlite3_stmt *pStmt;
  char *zFile;
  char *zTable;
  int rc;
  sqlite3_stmt *in_stack_00000198;
  char **in_stack_000002c8;
  sqlite3_stmt **in_stack_000002d0;
  int in_stack_000002dc;
  char *in_stack_000002e0;
  sqlite3 *in_stack_000002e8;
  sqlite3 *in_stack_fffffffffffffed8;
  FILE *pFVar11;
  sqlite3_stmt *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffeec;
  ShellState *in_stack_fffffffffffffef0;
  FILE *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  uint local_e8;
  uint local_e4;
  int local_e0;
  char local_d9;
  char *local_d8;
  undefined2 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff32;
  undefined1 in_stack_ffffffffffffff33;
  int in_stack_ffffffffffffff34;
  sqlite3_stmt *in_stack_ffffffffffffff38;
  sqlite3_callback xCallback;
  undefined4 in_stack_ffffffffffffff48;
  int iVar12;
  int iVar13;
  int iVar14;
  code *pcVar15;
  sqlite3_stmt *psVar16;
  FILE *local_98;
  undefined8 local_88;
  uint local_74;
  uint local_70;
  int local_68;
  int local_64;
  undefined1 uVar17;
  undefined4 in_stack_ffffffffffffffa0;
  sqlite3_stmt *local_38;
  sqlite3_stmt *local_30;
  int local_24;
  bool local_1;
  
  if (safe_mode) {
    fprintf(_stderr,".import cannot be used in -safe mode\n");
    local_1 = false;
  }
  else {
    local_30 = (sqlite3_stmt *)0x0;
    local_38 = (sqlite3_stmt *)0x0;
    iVar14 = 0;
    iVar13 = 0;
    iVar12 = 1;
    memset(&stack0xffffffffffffff60,0,0x48);
    if (*(int *)(in_RDI + 0x2c) == 10) {
      pcVar15 = ascii_read_one_field;
    }
    else {
      pcVar15 = csv_read_one_field;
    }
    for (xCallback = (sqlite3_callback)0x1; uVar17 = (undefined1)in_stack_ffffffffffffffa0,
        xCallback < in_RDX; xCallback = xCallback + 1) {
      in_stack_ffffffffffffff38 = *(sqlite3_stmt **)(in_RSI + (long)xCallback * 8);
      if ((*(char *)&in_stack_ffffffffffffff38->db == '-') &&
         (*(char *)((long)&in_stack_ffffffffffffff38->db + 1) == '-')) {
        in_stack_ffffffffffffff38 = (sqlite3_stmt *)((long)&in_stack_ffffffffffffff38->db + 1);
      }
      psVar16 = local_38;
      if (*(char *)&in_stack_ffffffffffffff38->db == '-') {
        iVar1 = strcmp((char *)in_stack_ffffffffffffff38,"-v");
        if (iVar1 == 0) {
          iVar14 = iVar14 + 1;
        }
        else {
          iVar1 = strcmp((char *)in_stack_ffffffffffffff38,"-skip");
          if ((iVar1 == 0) && (xCallback < in_RDX + -1)) {
            xCallback = xCallback + 1;
            sVar3 = integerValue((char *)in_stack_fffffffffffffef0);
            iVar13 = (int)sVar3;
          }
          else {
            iVar12 = strcmp((char *)in_stack_ffffffffffffff38,"-ascii");
            if (iVar12 == 0) {
              local_64 = 0x1f;
              in_stack_ffffffffffffffa0 = 0x1e;
              pcVar15 = ascii_read_one_field;
            }
            else {
              iVar12 = strcmp((char *)in_stack_ffffffffffffff38,"-csv");
              if (iVar12 != 0) {
                fprintf(*(FILE **)(in_RDI + 0x20),"ERROR: unknown option: \"%s\".  Usage:\n",
                        in_stack_ffffffffffffff38);
                showHelp(in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0);
                return false;
              }
              local_64 = 0x2c;
              in_stack_ffffffffffffffa0 = 10;
              pcVar15 = csv_read_one_field;
            }
            iVar12 = 0;
          }
        }
      }
      else {
        psVar16 = in_stack_ffffffffffffff38;
        if ((local_38 != (sqlite3_stmt *)0x0) &&
           (bVar10 = local_30 != (sqlite3_stmt *)0x0, psVar16 = local_38,
           local_30 = in_stack_ffffffffffffff38, bVar10)) {
          fprintf(*(FILE **)(in_RDI + 0x20),"ERROR: extra argument: \"%s\".  Usage:\n",
                  in_stack_ffffffffffffff38);
          showHelp(in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0);
          return false;
        }
      }
      local_38 = psVar16;
    }
    if (local_30 == (sqlite3_stmt *)0x0) {
      pcVar4 = "FILE TABLE";
      if (local_38 == (sqlite3_stmt *)0x0) {
        pcVar4 = "?DB? FILE";
      }
      fprintf(*(FILE **)(in_RDI + 0x20),"ERROR: missing %s argument. Usage:\n",pcVar4 + 5);
      showHelp(in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0);
      local_1 = false;
    }
    else {
      seenInterrupt = 0;
      OpenDB((ShellState *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
             (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
      if (iVar12 != 0) {
        iVar1 = std::__cxx11::string::size();
        if (iVar1 == 0) {
          fprintf(_stderr,"Error: non-null column separator required for import\n");
          return false;
        }
        if (1 < iVar1) {
          fprintf(_stderr,"Error: multi-character column separators not allowed for import\n");
          return false;
        }
        in_stack_ffffffffffffff34 = std::__cxx11::string::size();
        if (in_stack_ffffffffffffff34 == 0) {
          fprintf(_stderr,"Error: non-null row separator required for import\n");
          return false;
        }
        if (((in_stack_ffffffffffffff34 == 2) && (*(int *)(in_RDI + 0x2c) == 8)) &&
           (bVar10 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8)
           , bVar10)) {
          std::__cxx11::string::operator=((string *)(in_RDI + 0x80),anon_var_dwarf_3eb6436 + 8);
          in_stack_ffffffffffffff34 = std::__cxx11::string::size();
        }
        if (1 < in_stack_ffffffffffffff34) {
          fprintf(_stderr,"Error: multi-character row separators not allowed for import\n");
          return false;
        }
        pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI + 0x60);
        local_64 = (int)*pcVar4;
        puVar5 = (undefined1 *)std::__cxx11::string::operator[](in_RDI + 0x80);
        uVar17 = *puVar5;
      }
      if (*(char *)&local_38->db == '|') {
        local_98 = popen((char *)((long)&local_38->db + 1),"r");
        pcVar4 = "<pipe>";
      }
      else {
        pcVar4 = (char *)local_38;
        local_98 = fopen64((char *)local_38,"rb");
      }
      if (local_98 == (FILE *)0x0) {
        fprintf(_stderr,"Error: cannot open \"%s\"\n",local_38);
        local_1 = false;
      }
      else {
        if ((1 < iVar14) || ((0 < iVar14 && (iVar12 != 0)))) {
          in_stack_ffffffffffffff33 = 0;
          in_stack_ffffffffffffff32 = uVar17;
          fprintf(*(FILE **)(in_RDI + 0x20),"Column separator ");
          OutputCString(in_stack_fffffffffffffef0,
                        (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
          fprintf(*(FILE **)(in_RDI + 0x20),", row separator ");
          OutputCString(in_stack_fffffffffffffef0,
                        (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
          fprintf(*(FILE **)(in_RDI + 0x20),anon_var_dwarf_3eb6436 + 8);
        }
        while (iVar1 = iVar13 + -1, bVar10 = 0 < iVar13, iVar13 = iVar1, bVar10) {
          do {
            lVar6 = (*pcVar15)(&stack0xffffffffffffff60);
          } while (lVar6 != 0 && local_68 == local_64);
        }
        pcVar7 = duckdb_shell_sqlite3_mprintf("SELECT * FROM %s",local_30);
        if (pcVar7 == (char *)0x0) {
          import_cleanup((ImportCtx *)0x1ded86);
          shell_out_of_memory();
        }
        iVar8 = StringLength((char *)0x1ded98);
        local_24 = duckdb_shell_sqlite3_prepare_v2
                             (in_stack_000002e8,in_stack_000002e0,in_stack_000002dc,
                              in_stack_000002d0,in_stack_000002c8);
        import_append_char((ImportCtx *)in_stack_fffffffffffffee0,
                           (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
        if (local_24 != 0) {
          duckdb_shell_sqlite3_errmsg(in_stack_fffffffffffffed8);
          iVar13 = duckdb_shell_sqlite3_strglob
                             ((char *)in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
          if (iVar13 == 0) {
            local_d8 = duckdb_shell_sqlite3_mprintf("CREATE TABLE %s",local_30);
            local_d9 = '(';
            do {
              lVar6 = (*pcVar15)(&stack0xffffffffffffff60);
              if (lVar6 == 0) break;
              local_d8 = duckdb_shell_sqlite3_mprintf
                                   ("%z%c\n  \"%w\" TEXT",local_d8,(ulong)(uint)(int)local_d9,
                                    local_88);
              local_d9 = ',';
            } while (local_68 == local_64);
            if (local_d9 == '(') {
              duckdb_shell_sqlite3_free((void *)0x1dee99);
              import_cleanup((ImportCtx *)0x1deea6);
              fprintf(_stderr,"%s: empty file\n",pcVar4);
              return false;
            }
            pcVar7 = duckdb_shell_sqlite3_mprintf("%z\n)",local_d8);
            if (0 < iVar14) {
              fprintf(*(FILE **)(in_RDI + 0x20),"%s\n",pcVar7);
            }
            iVar13 = duckdb_shell_sqlite3_exec
                               ((sqlite3 *)CONCAT44(iVar14,iVar1),
                                (char *)CONCAT44(iVar12,in_stack_ffffffffffffff48),xCallback,
                                in_stack_ffffffffffffff38,
                                (char **)CONCAT44(in_stack_ffffffffffffff34,
                                                  CONCAT13(in_stack_ffffffffffffff33,
                                                           CONCAT12(in_stack_ffffffffffffff32,
                                                                    in_stack_ffffffffffffff30))));
            duckdb_shell_sqlite3_free((void *)0x1def3c);
            if (iVar13 != 0) {
              pFVar11 = _stderr;
              pcVar4 = duckdb_shell_sqlite3_errmsg(in_stack_fffffffffffffed8);
              fprintf(pFVar11,"CREATE TABLE %s(...) failed: %s\n",local_30,pcVar4);
              import_cleanup((ImportCtx *)0x1def97);
              return false;
            }
            local_24 = duckdb_shell_sqlite3_prepare_v2
                                 (in_stack_000002e8,in_stack_000002e0,in_stack_000002dc,
                                  in_stack_000002d0,in_stack_000002c8);
          }
        }
        duckdb_shell_sqlite3_free((void *)0x1defdf);
        if (local_24 == 0) {
          uVar2 = duckdb_shell_sqlite3_column_count((sqlite3_stmt *)in_stack_fffffffffffffed8);
          duckdb_shell_sqlite3_finalize
                    ((sqlite3_stmt *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
          if (uVar2 == 0) {
            local_1 = false;
          }
          else {
            pcVar7 = (char *)duckdb_shell_sqlite3_malloc64(0x1df08b);
            if (pcVar7 == (char *)0x0) {
              import_cleanup((ImportCtx *)0x1df0ab);
              shell_out_of_memory();
            }
            duckdb_shell_sqlite3_snprintf
                      ((int)(ulong)((int)iVar8 + 0x14),pcVar7,"INSERT INTO \"%w\" VALUES(?",local_30
                      );
            iVar8 = StringLength((char *)0x1df0e5);
            iVar13 = (int)iVar8;
            for (local_e0 = 1; local_e0 < (int)uVar2; local_e0 = local_e0 + 1) {
              iVar9 = iVar13 + 1;
              pcVar7[iVar13] = ',';
              iVar13 = iVar13 + 2;
              pcVar7[iVar9] = '?';
            }
            pcVar7[iVar13] = ')';
            pcVar7[iVar13 + 1] = '\0';
            if (1 < iVar14) {
              fprintf(*(FILE **)(in_RDI + 0x20),"Insert using: %s\n",pcVar7);
            }
            iVar13 = duckdb_shell_sqlite3_prepare_v2
                               (in_stack_000002e8,in_stack_000002e0,in_stack_000002dc,
                                in_stack_000002d0,in_stack_000002c8);
            duckdb_shell_sqlite3_free((void *)0x1df1e9);
            if (iVar13 == 0) {
              iVar13 = duckdb_shell_sqlite3_get_autocommit((sqlite3 *)0x1df23f);
              if (iVar13 != 0) {
                duckdb_shell_sqlite3_exec
                          ((sqlite3 *)CONCAT44(iVar14,iVar1),
                           (char *)CONCAT44(iVar12,in_stack_ffffffffffffff48),xCallback,
                           in_stack_ffffffffffffff38,
                           (char **)CONCAT44(in_stack_ffffffffffffff34,
                                             CONCAT13(in_stack_ffffffffffffff33,
                                                      CONCAT12(in_stack_ffffffffffffff32,
                                                               in_stack_ffffffffffffff30))));
              }
              do {
                local_e4 = 1;
                for (local_e8 = 0;
                    (((int)local_e8 < (int)uVar2 &&
                     ((pcVar7 = (char *)(*pcVar15)(&stack0xffffffffffffff60), pcVar7 != (char *)0x0
                      || (local_e8 != 0)))) &&
                    ((*(int *)(in_RDI + 0x2c) != 10 ||
                     (((pcVar7 != (char *)0x0 && (*pcVar7 != '\0')) || (local_e8 != 0))))));
                    local_e8 = local_e8 + 1) {
                  duckdb_shell_sqlite3_bind_text
                            (in_stack_00000028,in_stack_00000024,in_stack_00000018,in_stack_00000014
                             ,in_stack_00000008);
                  if (((int)local_e8 < (int)(uVar2 - 1)) && (local_68 != local_64)) {
                    fprintf(_stderr,
                            "%s:%d: expected %d columns but found %d - filling the rest with NULL\n"
                            ,pcVar4,1,(ulong)uVar2,(ulong)(local_e8 + 1));
                    for (local_e8 = local_e8 + 2; (int)local_e8 <= (int)uVar2;
                        local_e8 = local_e8 + 1) {
                      duckdb_shell_sqlite3_bind_null
                                ((sqlite3_stmt *)pcVar4,(int)((ulong)pcVar15 >> 0x20));
                    }
                  }
                }
                if (local_68 == local_64) {
                  do {
                    (*pcVar15)(&stack0xffffffffffffff60);
                    local_e8 = local_e8 + 1;
                  } while (local_68 == local_64);
                  fprintf(_stderr,"%s:%d: expected %d columns but found %d - extras ignored\n",
                          pcVar4,1,(ulong)uVar2,(ulong)local_e8);
                }
                if ((int)uVar2 <= (int)local_e8) {
                  duckdb_shell_sqlite3_step(in_stack_00000198);
                  iVar9 = duckdb_shell_sqlite3_reset(in_stack_fffffffffffffee0);
                  if (iVar9 == 0) {
                    local_74 = local_74 + 1;
                  }
                  else {
                    pFVar11 = _stderr;
                    psVar16 = (sqlite3_stmt *)pcVar4;
                    pcVar7 = duckdb_shell_sqlite3_errmsg((sqlite3 *)_stderr);
                    fprintf(pFVar11,"%s:%d: INSERT failed: %s\n",pcVar4,(ulong)local_e4,pcVar7);
                    local_70 = local_70 + 1;
                    in_stack_fffffffffffffee0 = (sqlite3_stmt *)pcVar4;
                    in_stack_fffffffffffffeec = local_e4;
                    pcVar4 = (char *)psVar16;
                  }
                }
              } while (local_68 != -1);
              import_cleanup((ImportCtx *)0x1df4e9);
              duckdb_shell_sqlite3_finalize
                        ((sqlite3_stmt *)
                         CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
              if (iVar13 != 0) {
                duckdb_shell_sqlite3_exec
                          ((sqlite3 *)CONCAT44(iVar14,iVar1),
                           (char *)CONCAT44(iVar12,in_stack_ffffffffffffff48),xCallback,
                           in_stack_ffffffffffffff38,
                           (char **)CONCAT44(in_stack_ffffffffffffff34,
                                             CONCAT13(in_stack_ffffffffffffff33,
                                                      CONCAT12(in_stack_ffffffffffffff32,
                                                               in_stack_ffffffffffffff30))));
              }
              if (0 < iVar14) {
                fprintf(*(FILE **)(in_RDI + 0x20),
                        "Added %d rows with %d errors using %d lines of input\n",(ulong)local_74,
                        (ulong)local_70,0);
              }
              local_1 = true;
            }
            else {
              ShellDatabaseError(in_stack_fffffffffffffef0,
                                 (sqlite3 *)
                                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
              import_cleanup((ImportCtx *)0x1df225);
              local_1 = false;
            }
          }
        }
        else {
          ShellDatabaseError(in_stack_fffffffffffffef0,
                             (sqlite3 *)
                             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
          import_cleanup((ImportCtx *)0x1df01b);
          local_1 = false;
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool ShellState::ImportData(const char **azArg, idx_t nArg) {
	if (safe_mode) {
		utf8_printf(stderr, ".import cannot be used in -safe mode\n");
		return false;
	}
	int rc;
	const char *zTable = nullptr;              /* Insert data into this table */
	const char *zFile = nullptr;               /* Name of file to extra content from */
	sqlite3_stmt *pStmt = nullptr;             /* A statement */
	int nCol;                                  /* Number of columns in the table */
	int nByte;                                 /* Number of bytes in an SQL string */
	int j;                                     /* Loop counters */
	int needCommit;                            /* True to COMMIT or ROLLBACK at end */
	char *zSql;                                /* An SQL statement */
	ImportCtx sCtx;                            /* Reader context */
	char *(SQLITE_CDECL * xRead)(ImportCtx *); /* Func to read one value */
	int eVerbose = 0;                          /* Larger for more console output */
	int nSkip = 0;                             /* Initial lines to skip */
	int useOutputMode = 1;                     /* Use output mode to determine separators */

	memset(&sCtx, 0, sizeof(sCtx));
	if (mode == RenderMode::ASCII) {
		xRead = ascii_read_one_field;
	} else {
		xRead = csv_read_one_field;
	}
	for (idx_t i = 1; i < nArg; i++) {
		auto z = azArg[i];
		if (z[0] == '-' && z[1] == '-')
			z++;
		if (z[0] != '-') {
			if (zFile == 0) {
				zFile = z;
			} else if (zTable == 0) {
				zTable = z;
			} else {
				utf8_printf(out, "ERROR: extra argument: \"%s\".  Usage:\n", z);
				showHelp(out, "import");
				return false;
			}
		} else if (strcmp(z, "-v") == 0) {
			eVerbose++;
		} else if (strcmp(z, "-skip") == 0 && i < nArg - 1) {
			nSkip = (int)integerValue(azArg[++i]);
		} else if (strcmp(z, "-ascii") == 0) {
			sCtx.cColSep = SEP_Unit[0];
			sCtx.cRowSep = SEP_Record[0];
			xRead = ascii_read_one_field;
			useOutputMode = 0;
		} else if (strcmp(z, "-csv") == 0) {
			sCtx.cColSep = ',';
			sCtx.cRowSep = '\n';
			xRead = csv_read_one_field;
			useOutputMode = 0;
		} else {
			utf8_printf(out, "ERROR: unknown option: \"%s\".  Usage:\n", z);
			showHelp(out, "import");
			return false;
		}
	}
	if (zTable == 0) {
		utf8_printf(out, "ERROR: missing %s argument. Usage:\n", zFile == 0 ? "FILE" : "TABLE");
		showHelp(out, "import");
		return false;
	}
	seenInterrupt = 0;
	OpenDB(0);
	if (useOutputMode) {
		/* If neither the --csv or --ascii options are specified, then set
		** the column and row separator characters from the output mode. */
		int nSep = colSeparator.size();
		if (nSep == 0) {
			raw_printf(stderr, "Error: non-null column separator required for import\n");
			return false;
		}
		if (nSep > 1) {
			raw_printf(stderr, "Error: multi-character column separators not allowed"
			                   " for import\n");
			return false;
		}
		nSep = rowSeparator.size();
		if (nSep == 0) {
			raw_printf(stderr, "Error: non-null row separator required for import\n");
			return false;
		}
		if (nSep == 2 && mode == RenderMode::CSV && rowSeparator == SEP_CrLf) {
			/* When importing CSV (only), if the row separator is set to the
			** default output row separator, change it to the default input
			** row separator.  This avoids having to maintain different input
			** and output row separators. */
			rowSeparator = SEP_Row;
			nSep = rowSeparator.size();
		}
		if (nSep > 1) {
			raw_printf(stderr, "Error: multi-character row separators not allowed"
			                   " for import\n");
			return false;
		}
		sCtx.cColSep = colSeparator[0];
		sCtx.cRowSep = rowSeparator[0];
	}
	sCtx.zFile = zFile;
	sCtx.nLine = 1;
	if (sCtx.zFile[0] == '|') {
#ifdef SQLITE_OMIT_POPEN
		raw_printf(stderr, "Error: pipes are not supported in this OS\n");
		rc = 1;
		goto meta_command_exit;
#else
		sCtx.in = popen(sCtx.zFile + 1, "r");
		sCtx.zFile = "<pipe>";
		sCtx.xCloser = pclose;
#endif
	} else {
		sCtx.in = fopen(sCtx.zFile, "rb");
		sCtx.xCloser = fclose;
	}
	if (sCtx.in == 0) {
		utf8_printf(stderr, "Error: cannot open \"%s\"\n", zFile);
		return false;
	}
	if (eVerbose >= 2 || (eVerbose >= 1 && useOutputMode)) {
		char zSep[2];
		zSep[1] = 0;
		zSep[0] = sCtx.cColSep;
		utf8_printf(out, "Column separator ");
		OutputCString(zSep);
		utf8_printf(out, ", row separator ");
		zSep[0] = sCtx.cRowSep;
		OutputCString(zSep);
		utf8_printf(out, "\n");
	}
	while ((nSkip--) > 0) {
		while (xRead(&sCtx) && sCtx.cTerm == sCtx.cColSep) {
		}
	}
	zSql = sqlite3_mprintf("SELECT * FROM %s", zTable);
	if (zSql == 0) {
		import_cleanup(&sCtx);
		shell_out_of_memory();
	}
	nByte = StringLength(zSql);
	rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0);
	import_append_char(&sCtx, 0); /* To ensure sCtx.z is allocated */
	if (rc && sqlite3_strglob("Catalog Error: Table with name *", sqlite3_errmsg(db)) == 0) {
		char *zCreate = sqlite3_mprintf("CREATE TABLE %s", zTable);
		char cSep = '(';
		while (xRead(&sCtx)) {
			zCreate = sqlite3_mprintf("%z%c\n  \"%w\" TEXT", zCreate, cSep, sCtx.z);
			cSep = ',';
			if (sCtx.cTerm != sCtx.cColSep)
				break;
		}
		if (cSep == '(') {
			sqlite3_free(zCreate);
			import_cleanup(&sCtx);
			utf8_printf(stderr, "%s: empty file\n", sCtx.zFile);
			return false;
		}
		zCreate = sqlite3_mprintf("%z\n)", zCreate);
		if (eVerbose >= 1) {
			utf8_printf(out, "%s\n", zCreate);
		}
		rc = sqlite3_exec(db, zCreate, 0, 0, 0);
		sqlite3_free(zCreate);
		if (rc) {
			utf8_printf(stderr, "CREATE TABLE %s(...) failed: %s\n", zTable, sqlite3_errmsg(db));
			import_cleanup(&sCtx);
			return false;
		}
		rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0);
	}
	sqlite3_free(zSql);
	if (rc) {
		if (pStmt)
			sqlite3_finalize(pStmt);
		ShellDatabaseError(db);
		import_cleanup(&sCtx);
		return false;
	}
	nCol = sqlite3_column_count(pStmt);
	sqlite3_finalize(pStmt);
	pStmt = 0;
	if (nCol == 0)
		return 0; /* no columns, no error */
	zSql = (char *)sqlite3_malloc64(nByte * 2 + 20 + nCol * 2);
	if (zSql == 0) {
		import_cleanup(&sCtx);
		shell_out_of_memory();
	}
	sqlite3_snprintf(nByte + 20, zSql, "INSERT INTO \"%w\" VALUES(?", zTable);
	j = StringLength(zSql);
	for (int i = 1; i < nCol; i++) {
		zSql[j++] = ',';
		zSql[j++] = '?';
	}
	zSql[j++] = ')';
	zSql[j] = 0;
	if (eVerbose >= 2) {
		utf8_printf(out, "Insert using: %s\n", zSql);
	}
	rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0);
	sqlite3_free(zSql);
	if (rc) {
		ShellDatabaseError(db);
		if (pStmt)
			sqlite3_finalize(pStmt);
		import_cleanup(&sCtx);
		return false;
	}
	needCommit = sqlite3_get_autocommit(db);
	if (needCommit)
		sqlite3_exec(db, "BEGIN", 0, 0, 0);
	do {
		int startLine = sCtx.nLine;
		int i;
		for (i = 0; i < nCol; i++) {
			char *z = xRead(&sCtx);
			/*
			** Did we reach end-of-file before finding any columns?
			** If so, stop instead of NULL filling the remaining columns.
			*/
			if (z == 0 && i == 0)
				break;
			/*
			** Did we reach end-of-file OR end-of-line before finding any
			** columns in ASCII mode?  If so, stop instead of NULL filling
			** the remaining columns.
			*/
			if (mode == RenderMode::ASCII && (z == 0 || z[0] == 0) && i == 0)
				break;
			sqlite3_bind_text(pStmt, i + 1, z, -1, SQLITE_TRANSIENT);
			if (i < nCol - 1 && sCtx.cTerm != sCtx.cColSep) {
				utf8_printf(stderr,
				            "%s:%d: expected %d columns but found %d - "
				            "filling the rest with NULL\n",
				            sCtx.zFile, startLine, nCol, i + 1);
				i += 2;
				while (i <= nCol) {
					sqlite3_bind_null(pStmt, i);
					i++;
				}
			}
		}
		if (sCtx.cTerm == sCtx.cColSep) {
			do {
				xRead(&sCtx);
				i++;
			} while (sCtx.cTerm == sCtx.cColSep);
			utf8_printf(stderr,
			            "%s:%d: expected %d columns but found %d - "
			            "extras ignored\n",
			            sCtx.zFile, startLine, nCol, i);
		}
		if (i >= nCol) {
			sqlite3_step(pStmt);
			rc = sqlite3_reset(pStmt);
			if (rc != SQLITE_OK) {
				utf8_printf(stderr, "%s:%d: INSERT failed: %s\n", sCtx.zFile, startLine, sqlite3_errmsg(db));
				sCtx.nErr++;
			} else {
				sCtx.nRow++;
			}
		}
	} while (sCtx.cTerm != EOF);

	import_cleanup(&sCtx);
	sqlite3_finalize(pStmt);
	if (needCommit)
		sqlite3_exec(db, "COMMIT", 0, 0, 0);
	if (eVerbose > 0) {
		utf8_printf(out, "Added %d rows with %d errors using %d lines of input\n", sCtx.nRow, sCtx.nErr,
		            sCtx.nLine - 1);
	}
	return true;
}